

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PrimRectUV(ImDrawList *this,ImVec2 *a,ImVec2 *c,ImVec2 *uv_a,ImVec2 *uv_c,ImU32 col)

{
  int iVar1;
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  long in_RDI;
  float *in_R8;
  undefined4 in_R9D;
  uint idx;
  ImVec2 uv_d;
  ImVec2 uv_b;
  ImVec2 d;
  ImVec2 b;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  undefined4 local_2c;
  float *local_28;
  float *local_20;
  float *local_18;
  float *local_10;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ImVec2::ImVec2(&local_34,*in_RDX,in_RSI[1]);
  ImVec2::ImVec2(&local_3c,*local_10,local_18[1]);
  ImVec2::ImVec2(&local_44,*local_28,local_20[1]);
  ImVec2::ImVec2(&local_4c,*local_20,local_28[1]);
  iVar1 = *(int *)(in_RDI + 0x4c);
  **(int **)(in_RDI + 0x58) = iVar1;
  *(int *)(*(long *)(in_RDI + 0x58) + 4) = iVar1 + 1;
  *(int *)(*(long *)(in_RDI + 0x58) + 8) = iVar1 + 2;
  *(int *)(*(long *)(in_RDI + 0x58) + 0xc) = iVar1;
  *(int *)(*(long *)(in_RDI + 0x58) + 0x10) = iVar1 + 2;
  *(int *)(*(long *)(in_RDI + 0x58) + 0x14) = iVar1 + 3;
  **(undefined8 **)(in_RDI + 0x50) = *(undefined8 *)local_10;
  *(undefined8 *)(*(long *)(in_RDI + 0x50) + 8) = *(undefined8 *)local_20;
  *(undefined4 *)(*(long *)(in_RDI + 0x50) + 0x10) = local_2c;
  *(ImVec2 *)(*(long *)(in_RDI + 0x50) + 0x14) = local_34;
  *(ImVec2 *)(*(long *)(in_RDI + 0x50) + 0x1c) = local_44;
  *(undefined4 *)(*(long *)(in_RDI + 0x50) + 0x24) = local_2c;
  *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x28) = *(undefined8 *)local_18;
  *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x30) = *(undefined8 *)local_28;
  *(undefined4 *)(*(long *)(in_RDI + 0x50) + 0x38) = local_2c;
  *(ImVec2 *)(*(long *)(in_RDI + 0x50) + 0x3c) = local_3c;
  *(ImVec2 *)(*(long *)(in_RDI + 0x50) + 0x44) = local_4c;
  *(undefined4 *)(*(long *)(in_RDI + 0x50) + 0x4c) = local_2c;
  *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 0x50;
  *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x4c) + 4;
  *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + 0x18;
  return;
}

Assistant:

void ImDrawList::PrimRectUV(const ImVec2& a, const ImVec2& c, const ImVec2& uv_a, const ImVec2& uv_c, ImU32 col)
{
    ImVec2 b(c.x, a.y), d(a.x, c.y), uv_b(uv_c.x, uv_a.y), uv_d(uv_a.x, uv_c.y);
    ImDrawIdx idx = (ImDrawIdx)_VtxCurrentIdx;
    _IdxWritePtr[0] = idx; _IdxWritePtr[1] = (ImDrawIdx)(idx+1); _IdxWritePtr[2] = (ImDrawIdx)(idx+2);
    _IdxWritePtr[3] = idx; _IdxWritePtr[4] = (ImDrawIdx)(idx+2); _IdxWritePtr[5] = (ImDrawIdx)(idx+3);
    _VtxWritePtr[0].pos = a; _VtxWritePtr[0].uv = uv_a; _VtxWritePtr[0].col = col;
    _VtxWritePtr[1].pos = b; _VtxWritePtr[1].uv = uv_b; _VtxWritePtr[1].col = col;
    _VtxWritePtr[2].pos = c; _VtxWritePtr[2].uv = uv_c; _VtxWritePtr[2].col = col;
    _VtxWritePtr[3].pos = d; _VtxWritePtr[3].uv = uv_d; _VtxWritePtr[3].col = col;
    _VtxWritePtr += 4;
    _VtxCurrentIdx += 4;
    _IdxWritePtr += 6;
}